

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest::Run
          (CommandLineInterfaceTest *this,string *command)

{
  string_view command_00;
  AlphaNum local_98;
  char *local_68;
  size_t local_60;
  AlphaNum local_48;
  
  if (this->disallow_plugins_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"prefix-",(allocator<char> *)&local_48);
    CommandLineInterface::AllowPlugins
              (&(this->super_CommandLineInterfaceTester).cli_,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    local_98.piece_ = absl::lts_20250127::NullSafeStringView(" ");
    compiler::(anonymous_namespace)::CreatePluginArg_abi_cxx11_();
    local_48.piece_._M_len = local_60;
    local_48.piece_._M_str = local_68;
    absl::lts_20250127::StrAppend(command,&local_98,&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  command_00._M_str = (command->_M_dataplus)._M_p;
  command_00._M_len = command->_M_string_length;
  CommandLineInterfaceTester::RunProtoc(&this->super_CommandLineInterfaceTester,command_00);
  return;
}

Assistant:

void CommandLineInterfaceTest::Run(std::string command) {
  if (!disallow_plugins_) {
    AllowPlugins("prefix-");
    absl::StrAppend(&command, " ", CreatePluginArg());
  }

  RunProtoc(command);
}